

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestParseEvent(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f8;
  allocator<char> local_691;
  string local_690;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_66c;
  undefined1 local_66b;
  allocator<char> local_66a;
  allocator<char> local_669;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  string local_640 [32];
  iterator local_620;
  size_type local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  events;
  string local_598 [32];
  istringstream local_578 [8];
  istringstream is_2;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8 [32];
  istringstream local_388 [8];
  istringstream is_1;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  allocator<char> local_1a9;
  string local_1a8 [32];
  istringstream local_188 [8];
  istringstream is;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"event",&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,local_1a8,8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  ParseEvent_abi_cxx11_(&local_1e0,(istream *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Parse event without leading spaces",&local_201);
  AssertEqual<std::__cxx11::string,char[6]>(&local_1e0,(char (*) [6])0x1400ed,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::istringstream::~istringstream(local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a8,"   sport event ",&local_3a9);
  std::__cxx11::istringstream::istringstream(local_388,local_3a8,8);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  ParseEvent_abi_cxx11_(&local_3d0,(istream *)local_388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Parse event with leading spaces",&local_3f1);
  AssertEqual<std::__cxx11::string,char[13]>(&local_3d0,(char (*) [13])0x1400a7,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::istringstream::~istringstream(local_388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"  first event  \n  second event",
             (allocator<char> *)
             ((long)&events.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::istringstream::istringstream(local_578,local_598,8);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&events.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5b8);
  ParseEvent_abi_cxx11_(&local_5d8,(istream *)local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5b8,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  ParseEvent_abi_cxx11_(&local_5f8,(istream *)local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5b8,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  local_66b = 1;
  local_668 = &local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_660,"first event  ",&local_669);
  local_668 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"second event",&local_66a);
  local_66b = 0;
  local_620 = &local_660;
  local_618 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_66c);
  __l._M_len = local_618;
  __l._M_array = local_620;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_610,__l,&local_66c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"Parse multiple events",&local_691);
  AssertEqual<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5b8,&local_610,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_610);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_66c);
  local_6f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_620;
  do {
    local_6f8 = local_6f8 + -1;
    std::__cxx11::string::~string((string *)local_6f8);
  } while (local_6f8 != &local_660);
  std::allocator<char>::~allocator(&local_66a);
  std::allocator<char>::~allocator(&local_669);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5b8);
  std::__cxx11::istringstream::~istringstream(local_578);
  return;
}

Assistant:

void TestParseEvent() {
    {
        istringstream is("event");
        AssertEqual(ParseEvent(is), "event", "Parse event without leading spaces");
    }
    {
        istringstream is("   sport event ");
        AssertEqual(ParseEvent(is), "sport event ", "Parse event with leading spaces");
    }
    {
        istringstream is("  first event  \n  second event");
        vector<string> events;
        events.push_back(ParseEvent(is));
        events.push_back(ParseEvent(is));
        AssertEqual(events, vector<string>{"first event  ", "second event"}, "Parse multiple events");
    }
}